

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

ImageAndMetadata *
pbrt::Image::Read(ImageAndMetadata *__return_storage_ptr__,string *name,Allocator alloc,
                 ColorEncodingHandle *encoding)

{
  _Rb_tree_header *p_Var1;
  V2f VVar2;
  float fVar3;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> aVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  LodePNGColorType LVar7;
  V2f *pVVar8;
  undefined1 auVar9 [32];
  size_t sVar10;
  size_t sVar11;
  undefined8 uVar12;
  size_t sVar13;
  LodePNGDecompressSettings LVar14;
  undefined1 auVar15 [64];
  bool bVar16;
  bool bVar17;
  ushort uVar18;
  ushort uVar19;
  uint i;
  int iVar20;
  LodePNGColorType LVar21;
  uint uVar22;
  Box2i *pBVar23;
  Header *pHVar24;
  TypedAttribute<float> *pTVar25;
  TypedAttribute<Imath_2_5::Matrix44<float>_> *pTVar26;
  int *piVar27;
  TypedAttribute<int> *pTVar28;
  _Rb_tree_node_base *p_Var29;
  _Rb_tree_node_base *p_Var30;
  char *pcVar31;
  size_t sVar32;
  mapped_type *this;
  Allocator AVar33;
  TypedAttribute<Imf_2_5::Chromaticities> *pTVar34;
  FILE *__stream;
  float *pfVar35;
  void *pvVar36;
  stbi_uc *first;
  pbrt *ppVar37;
  ulong uVar38;
  uint uVar39;
  ulong uVar40;
  int bufferLength;
  Point2i PVar41;
  int bufferLength_00;
  Point2i resolution;
  int bufferLength_01;
  int bufferLength_02;
  Point2i resolution_00;
  Point2i resolution_01;
  Point2i resolution_02;
  Point2i resolution_03;
  Point2i resolution_04;
  Point2i resolution_05;
  Vec2<int> VVar42;
  Point2i resolution_06;
  long *plVar43;
  long lVar44;
  undefined1 auVar53 [16];
  ulong uVar45;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar46;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *this_00;
  _Rb_tree_color _Var47;
  uint uVar48;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *this_01;
  Half *pHVar49;
  ulong uVar50;
  GammaColorEncoding *pGVar51;
  Point2i resolution_07;
  Point2i resolution_08;
  Point2i resolution_09;
  Point2i resolution_10;
  Point2i resolution_11;
  Vec2<int> VVar52;
  Point2i resolution_12;
  Point2i resolution_13;
  Point2i resolution_14;
  undefined1 auVar54 [64];
  Float FVar55;
  undefined1 auVar56 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_02;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_03;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_04;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_05;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_06;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_07;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_08;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_09;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_10;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_11;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_12;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_13;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_14;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_15;
  string_view str;
  string_view str_00;
  string_view str_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_02;
  int height;
  int width;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf_1;
  float scale;
  InputFile file;
  string ret;
  Float rgba [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  channelNames;
  LodePNGState state;
  uint local_5b8;
  uint local_5b4;
  Vec2<int> local_5b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_5a8;
  Vec2<int> local_590;
  undefined1 local_588 [32];
  Vec2<int> local_568;
  Vec2<int> VStack_560;
  ulong local_550;
  undefined1 local_548 [16];
  undefined1 auStack_538 [8];
  float fStack_530;
  float fStack_52c;
  _Base_ptr p_Stack_528;
  size_t sStack_520;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_518;
  undefined1 local_510 [24];
  size_t local_4f8;
  undefined1 local_4f0 [24];
  size_t local_4d8;
  undefined1 local_4d0 [24];
  size_t local_4b8;
  undefined1 local_4a8 [8];
  V2f VStack_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_498;
  long *plStack_488;
  size_t sStack_480;
  long lStack_478;
  undefined1 auStack_470 [8];
  long *plStack_468;
  uint uStack_460;
  undefined4 uStack_45c;
  undefined8 uStack_458;
  undefined1 auStack_450 [8];
  undefined8 uStack_448;
  undefined4 uStack_440;
  undefined4 uStack_43c;
  Half HStack_438;
  undefined2 uStack_436;
  undefined4 uStack_434;
  undefined1 auStack_430 [20];
  uint uStack_41c;
  size_t sStack_418;
  undefined8 uStack_410;
  bool local_408;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_404;
  bool local_3fc;
  aligned_storage_t<sizeof(int),_alignof(int)> local_3f8;
  bool local_3f4;
  aligned_storage_t<sizeof(float),_alignof(float)> local_3f0;
  bool local_3ec;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_3e8;
  bool local_3e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_3d8;
  undefined1 local_3a8 [12];
  float fStack_39c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_398 [2];
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_378;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_370;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_350;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_330;
  ulong local_308;
  long local_300;
  Box2i local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  undefined2 local_2c8 [8];
  long *local_2b8 [2];
  long local_2a8 [2];
  long *local_298 [2];
  long local_288 [2];
  undefined1 local_278 [8];
  undefined1 auStack_270 [8];
  undefined1 auStack_268 [16];
  undefined1 *puStack_258;
  size_t sStack_250;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  TStack_248;
  undefined1 auStack_240 [8];
  long *plStack_238;
  uint local_230;
  uint uStack_22c;
  undefined8 uStack_228;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> vStack_220;
  undefined1 auStack_200 [20];
  undefined1 local_1ec;
  size_t local_1e8;
  uchar *puStack_1e0;
  bool local_1d8;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_1d4;
  bool local_1cc;
  aligned_storage_t<sizeof(int),_alignof(int)> local_1c8;
  bool local_1c4;
  aligned_storage_t<sizeof(float),_alignof(float)> local_1c0;
  bool local_1bc;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_1b8;
  LodePNGColorType local_1b0;
  uint local_1ac;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_1a8 [4];
  Vec2<int> local_d0;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_c8;
  Vec2<int> local_a8;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_a0;
  Vec2<int> local_80;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_78;
  Vec2<int> local_58;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_50;
  
  VVar2 = (V2f)((long)auStack_270 + 8);
  local_278 = (undefined1  [8])VVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"exr","");
  local_5b0 = (Vec2<int>)name;
  bVar16 = HasExtension(name,(string *)local_278);
  if ((V2f)local_278 != VVar2) {
    operator_delete((void *)local_278,auStack_268._0_8_ + 1);
  }
  if (bVar16) {
    pcVar31 = *(char **)local_5b0;
    iVar20 = Imf_2_5::globalThreadCount();
    Imf_2_5::InputFile::InputFile((InputFile *)local_588,pcVar31,iVar20);
    Imf_2_5::InputFile::header();
    pBVar23 = (Box2i *)Imf_2_5::Header::dataWindow();
    local_568 = pBVar23->min;
    VStack_560 = pBVar23->max;
    local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._0_16_ = *pBVar23;
    local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1a8[0]._M_impl.super__Rb_tree_header._M_header;
    local_278[4] = 0;
    local_230 = local_230 & 0xffffff00;
    local_1ec = 0;
    local_1d8 = false;
    local_1cc = false;
    local_1c4 = false;
    local_1bc = false;
    local_1b0 = local_1b0 & 0xffffff00;
    local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1a8[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_left;
    pHVar24 = (Header *)Imf_2_5::InputFile::header();
    pTVar25 = Imf_2_5::Header::findTypedAttribute<Imf_2_5::TypedAttribute<float>>
                        (pHVar24,"renderTimeSeconds");
    if (pTVar25 != (TypedAttribute<float> *)0x0) {
      local_278[4] = 1;
      local_278._0_4_ = pTVar25->_value;
    }
    pHVar24 = (Header *)Imf_2_5::InputFile::header();
    pTVar26 = Imf_2_5::Header::
              findTypedAttribute<Imf_2_5::TypedAttribute<Imath_2_5::Matrix44<float>>>
                        (pHVar24,"worldToCamera");
    if (pTVar26 != (TypedAttribute<Imath_2_5::Matrix44<float>_> *)0x0) {
      auVar54 = vmovdqu64_avx512f(*(undefined1 (*) [64])(pTVar26->_value).x);
      _auStack_270 = vmovdqu64_avx512f(auVar54);
      local_230 = CONCAT31(local_230._1_3_,1);
    }
    pHVar24 = (Header *)Imf_2_5::InputFile::header();
    pTVar26 = Imf_2_5::Header::
              findTypedAttribute<Imf_2_5::TypedAttribute<Imath_2_5::Matrix44<float>>>
                        (pHVar24,"worldToNDC");
    if (pTVar26 != (TypedAttribute<Imath_2_5::Matrix44<float>_> *)0x0) {
      auVar54 = vmovdqu64_avx512f(*(undefined1 (*) [64])(pTVar26->_value).x);
      auVar54 = vmovdqu64_avx512f(auVar54);
      uStack_22c = auVar54._0_4_;
      uStack_228._0_2_ = auVar54._4_2_;
      uStack_228._2_2_ = auVar54._6_2_;
      stack0xfffffffffffffddc = auVar54._8_8_;
      vStack_220._4_8_ = auVar54._16_8_;
      vStack_220._12_8_ = auVar54._24_8_;
      vStack_220._20_8_ = auVar54._32_8_;
      stack0xfffffffffffffdfc = auVar54._40_8_;
      auStack_200._4_8_ = auVar54._48_8_;
      auStack_200._12_8_ = auVar54._56_8_;
      local_1ec = 1;
    }
    LVar21 = VStack_560.x + 1;
    uVar39 = VStack_560.y + 1;
    LVar7 = local_568.x;
    if ((int)LVar21 < local_568.x) {
      LVar7 = LVar21;
    }
    uVar48 = local_568.y;
    if ((int)uVar39 < local_568.y) {
      uVar48 = uVar39;
    }
    local_1e8 = CONCAT44(uVar48,LVar7);
    if ((int)LVar21 < local_568.x) {
      LVar21 = local_568.x;
    }
    if ((int)uVar39 < local_568.y) {
      uVar39 = local_568.y;
    }
    puStack_1e0 = (uchar *)CONCAT44(uVar39,LVar21);
    local_1d8 = true;
    Imf_2_5::InputFile::header();
    piVar27 = (int *)Imf_2_5::Header::displayWindow();
    local_1d4._0_4_ = (piVar27[2] - *piVar27) + 1;
    local_1d4._4_4_ = (piVar27[3] - piVar27[1]) + 1;
    local_1cc = true;
    pHVar24 = (Header *)Imf_2_5::InputFile::header();
    pTVar28 = Imf_2_5::Header::findTypedAttribute<Imf_2_5::TypedAttribute<int>>
                        (pHVar24,"samplesPerPixel");
    if (pTVar28 != (TypedAttribute<int> *)0x0) {
      local_1c8 = (aligned_storage_t<sizeof(int),_alignof(int)>)pTVar28->_value;
      local_1c4 = true;
    }
    pHVar24 = (Header *)Imf_2_5::InputFile::header();
    pTVar25 = Imf_2_5::Header::findTypedAttribute<Imf_2_5::TypedAttribute<float>>(pHVar24,"MSE");
    if (pTVar25 != (TypedAttribute<float> *)0x0) {
      local_1c0 = (aligned_storage_t<sizeof(float),_alignof(float)>)pTVar25->_value;
      local_1bc = true;
    }
    local_568 = (Vec2<int>)alloc.memoryResource;
    Imf_2_5::InputFile::header();
    p_Var29 = (_Rb_tree_node_base *)Imf_2_5::Header::begin();
    this_01 = local_1a8;
    while( true ) {
      Imf_2_5::InputFile::header();
      p_Var30 = (_Rb_tree_node_base *)Imf_2_5::Header::end();
      if (p_Var29 == p_Var30) break;
      pcVar31 = (char *)(**(code **)(**(long **)(p_Var29 + 9) + 0x10))();
      iVar20 = strcmp(pcVar31,"stringvector");
      if (iVar20 == 0) {
        lVar44 = *(long *)(p_Var29 + 9);
        local_4a8 = (undefined1  [8])&aStack_498;
        sVar32 = strlen((char *)(p_Var29 + 1));
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_4a8,p_Var29 + 1,(long)&p_Var29[1]._M_color + sVar32);
        this = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                             *)this_01,(key_type *)local_4a8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(lVar44 + 8));
        if (local_4a8 != (undefined1  [8])&aStack_498) {
          operator_delete((void *)local_4a8,(ulong)(aStack_498._M_allocated_capacity + 1));
        }
      }
      p_Var29 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var29);
    }
    pHVar24 = (Header *)Imf_2_5::InputFile::header();
    pTVar34 = Imf_2_5::Header::findTypedAttribute<Imf_2_5::TypedAttribute<Imf_2_5::Chromaticities>>
                        (pHVar24,"chromaticities");
    if (pTVar34 != (TypedAttribute<Imf_2_5::Chromaticities> *)0x0) {
      local_548._0_8_ = (pTVar34->_value).red;
      local_548._8_8_ = (pTVar34->_value).green;
      auStack_538 = *(undefined1 (*) [8])&(pTVar34->_value).blue;
      _fStack_530 = (pTVar34->_value).white;
      local_1b8 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                   )RGBColorSpace::Lookup
                              ((Point2f)(pTVar34->_value).red,(Point2f)(pTVar34->_value).green,
                               (Point2f)(pTVar34->_value).blue,(Point2f)(pTVar34->_value).white);
      if (local_1b8 ==
          (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
           )0x0) {
        local_4a8 = (undefined1  [8])&aStack_498;
        VStack_4a0 = (V2f)0x0;
        aStack_498._M_allocated_capacity = aStack_498._M_allocated_capacity & 0xffffffffffffff00;
        detail::stringPrintfRecursive<float&,float&,float&,float&,float&,float&,float&,float&>
                  ((string *)local_4a8,
                   "Couldn\'t find supported color space that matches chromaticities: r (%f, %f) g (%f, %f) b (%f, %f), w (%f, %f). Using sRGB."
                   ,(float *)local_548,(float *)(local_548 + 4),(float *)(local_548 + 8),
                   (float *)(local_548 + 0xc),(float *)auStack_538,(float *)(auStack_538 + 4),
                   &fStack_530,&fStack_52c);
        Warning((FileLoc *)0x0,(char *)local_4a8);
        local_1b8 = RGBColorSpace::sRGB;
        if (local_4a8 != (undefined1  [8])&aStack_498) {
          operator_delete((void *)local_4a8,(ulong)(aStack_498._M_allocated_capacity + 1));
          local_1b8 = RGBColorSpace::sRGB;
        }
      }
      local_1b0 = CONCAT31(local_1b0._1_3_,1);
    }
    aStack_2e8._M_allocated_capacity = 0;
    local_2f8.min.x = 0;
    local_2f8.min.y = 0;
    local_2f8.max.x = 0;
    local_2f8.max.y = 0;
    local_5b4 = ((int)local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (int)local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) + 1;
    local_5b8 = (local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish._4_4_ -
                local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start._4_4_) + 1;
    Imf_2_5::InputFile::header();
    Imf_2_5::Header::channels();
    p_Var29 = (_Rb_tree_node_base *)Imf_2_5::ChannelList::begin();
    iVar20 = 0;
    do {
      p_Var30 = (_Rb_tree_node_base *)Imf_2_5::ChannelList::end();
      _Var47 = (_Rb_tree_color)this_01;
      if (p_Var29 == p_Var30) {
        if (_Var47 - _S_black < 2) {
          local_590.x = 0;
          local_590.y = 0;
          PVar41.super_Tuple2<pbrt::Point2,_int>.y = local_5b8;
          PVar41.super_Tuple2<pbrt::Point2,_int>.x = local_5b4;
          channels_00.n = (long)local_2f8.max - (long)local_2f8.min >> 5;
          channels_00.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8.min;
          Image((Image *)local_4a8,(_Var47 != _S_black) + Half,PVar41,channels_00,
                (ColorEncodingHandle *)&local_590,(Allocator)local_568);
          AllChannelsDesc((ImageChannelDesc *)local_3a8,(Image *)local_4a8);
          imageToFrameBuffer((FrameBuffer *)local_548,(Image *)local_4a8,
                             (ImageChannelDesc *)local_3a8,(Box2i *)&local_5a8);
          Imf_2_5::InputFile::setFrameBuffer((FrameBuffer *)local_588);
          std::
          _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                       *)local_548);
          InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                    ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)local_3a8);
          Imf_2_5::InputFile::readPixels
                    ((int)local_588,
                     local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_);
          if (LOGGING_LogLevel < 1) {
            local_548._8_4_ = 0.0;
            local_548._12_4_ = 0.0;
            auStack_538 = (undefined1  [8])((ulong)auStack_538 & 0xffffffffffffff00);
            local_548._0_8_ = auStack_538;
            detail::stringPrintfRecursive<std::__cxx11::string_const&,int&,int&>
                      ((string *)local_548,"Read EXR image %s (%d x %d)",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5b0,(int *)&local_5b4,(int *)&local_5b8);
            Log(Verbose,
                "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                ,0x438,(char *)local_548._0_8_);
            if ((undefined1 *)local_548._0_8_ != auStack_538) {
              operator_delete((void *)local_548._0_8_,(long)auStack_538 + 1);
            }
          }
          sVar13 = sStack_418;
          plVar43 = plStack_468;
          uVar12 = aStack_498._8_8_;
          auVar5._8_8_ = sStack_480;
          auVar5._0_8_ = plStack_488;
          auVar5._16_2_ = (undefined2)lStack_478;
          auVar5._18_6_ = lStack_478._2_6_;
          auVar5._24_8_ = auStack_470;
          (__return_storage_ptr__->image).resolution.super_Tuple2<pbrt::Point2,_int>.y =
               (int)VStack_4a0.x;
          (__return_storage_ptr__->image).format = local_4a8._0_4_;
          (__return_storage_ptr__->image).resolution.super_Tuple2<pbrt::Point2,_int>.x =
               local_4a8._4_4_;
          (__return_storage_ptr__->image).channelNames.alloc.memoryResource =
               (memory_resource *)aStack_498._M_allocated_capacity;
          aStack_498._8_8_ = 0;
          plStack_488 = (long *)0x0;
          (__return_storage_ptr__->image).channelNames.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar12;
          sStack_480 = 0;
          auVar9._2_6_ = lStack_478._2_6_;
          auVar9._0_2_ = (undefined2)lStack_478;
          auVar9._8_8_ = auStack_470;
          auVar9._16_8_ = plStack_468;
          auVar9._24_4_ = uStack_460;
          auVar9._28_4_ = uStack_45c;
          auVar5 = vperm2i128_avx2(auVar5,auVar9,0x20);
          *(undefined1 (*) [32])&(__return_storage_ptr__->image).channelNames.nAlloc = auVar5;
          sVar10 = CONCAT44(uStack_45c,uStack_460);
          sVar11 = CONCAT44(uStack_458._4_4_,CONCAT22(uStack_458._2_2_,(undefined2)uStack_458));
          uStack_458._0_2_ = 0;
          uStack_458._2_2_ = 0;
          uStack_458._4_4_ = 0;
          plStack_468 = (long *)0x0;
          uStack_460 = 0;
          uStack_45c = 0;
          pHVar49 = (Half *)CONCAT44(uStack_448._4_4_,(undefined4)uStack_448);
          (__return_storage_ptr__->image).p8.nAlloc = sVar10;
          (__return_storage_ptr__->image).p8.nStored = sVar11;
          sVar10 = CONCAT44(uStack_43c,uStack_440);
          sVar11 = CONCAT44(uStack_434,CONCAT22(uStack_436,HStack_438.h));
          HStack_438.h = 0;
          uStack_436 = 0;
          uStack_434 = 0;
          uStack_448._0_4_ = 0;
          uStack_448._4_4_ = 0;
          uStack_440 = 0;
          uStack_43c = 0;
          (__return_storage_ptr__->image).p8.ptr = (uchar *)plVar43;
          (__return_storage_ptr__->image).p16.alloc.memoryResource =
               (memory_resource *)CONCAT44(auStack_450._4_4_,auStack_450._0_4_);
          (__return_storage_ptr__->image).p16.nAlloc = sVar10;
          (__return_storage_ptr__->image).p16.nStored = sVar11;
          sVar10 = CONCAT44(uStack_41c,auStack_430._16_4_);
          (__return_storage_ptr__->image).p16.ptr = pHVar49;
          pfVar35 = (float *)CONCAT44(auStack_430._12_4_,auStack_430._8_4_);
          sStack_418 = 0;
          (__return_storage_ptr__->image).p32.alloc.memoryResource =
               (memory_resource *)CONCAT44(auStack_430._4_4_,auStack_430._0_4_);
          auStack_430._8_4_ = 0;
          auStack_430._12_4_ = 0;
          auStack_430._16_4_ = 0;
          uStack_41c = 0;
          (__return_storage_ptr__->image).p32.nAlloc = sVar10;
          (__return_storage_ptr__->image).p32.nStored = sVar13;
          (__return_storage_ptr__->image).p32.ptr = pfVar35;
          (__return_storage_ptr__->metadata).renderTimeSeconds.set = (bool)local_278[4];
          if ((bool)local_278[4] == true) {
            (__return_storage_ptr__->metadata).renderTimeSeconds.optionalValue =
                 (aligned_storage_t<sizeof(float),_alignof(float)>)local_278._0_4_;
          }
          (__return_storage_ptr__->metadata).cameraFromWorld.set = local_230._0_1_;
          if (local_230._0_1_ == true) {
            auVar54 = vmovdqu64_avx512f(_auStack_270);
            aVar4 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>
                     )vmovdqu64_avx512f(auVar54);
            (__return_storage_ptr__->metadata).cameraFromWorld.optionalValue = aVar4;
          }
          (__return_storage_ptr__->metadata).NDCFromWorld.set = (bool)local_1ec;
          if ((bool)local_1ec == true) {
            auVar54._4_2_ = (undefined2)uStack_228;
            auVar54._0_4_ = uStack_22c;
            auVar54._6_2_ = uStack_228._2_2_;
            auVar54._8_8_ = stack0xfffffffffffffddc;
            auVar54._16_8_ = vStack_220._4_8_;
            auVar54._24_8_ = vStack_220._12_8_;
            auVar54._32_8_ = vStack_220._20_8_;
            auVar54._40_8_ = stack0xfffffffffffffdfc;
            auVar54._48_8_ = auStack_200._4_8_;
            auVar54._56_8_ = auStack_200._12_8_;
            auVar54 = vmovdqu64_avx512f(auVar54);
            aVar4 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>
                     )vmovdqu64_avx512f(auVar54);
            (__return_storage_ptr__->metadata).NDCFromWorld.optionalValue = aVar4;
          }
          (__return_storage_ptr__->metadata).pixelBounds.set = local_1d8;
          if (local_1d8 == true) {
            *(size_t *)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue = local_1e8;
            *(uchar **)((long)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue + 8) =
                 puStack_1e0;
          }
          (__return_storage_ptr__->metadata).fullResolution.set = local_1cc;
          if (local_1cc == true) {
            (__return_storage_ptr__->metadata).fullResolution.optionalValue = local_1d4;
          }
          (__return_storage_ptr__->metadata).samplesPerPixel.set = local_1c4;
          if (local_1c4 == true) {
            (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue = local_1c8;
          }
          (__return_storage_ptr__->metadata).MSE.set = local_1bc;
          if (local_1bc == true) {
            (__return_storage_ptr__->metadata).MSE.optionalValue = local_1c0;
          }
          (__return_storage_ptr__->metadata).colorSpace.set = (bool)(undefined1)local_1b0;
          if ((bool)(undefined1)local_1b0 == true) {
            (__return_storage_ptr__->metadata).colorSpace.optionalValue = local_1b8;
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::_Rb_tree(&(__return_storage_ptr__->metadata).stringVectors._M_t,local_1a8);
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                    ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)auStack_430);
          pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
                    ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)
                     auStack_450);
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                     auStack_470);
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&aStack_498);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_2f8);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~_Rb_tree(local_1a8);
          Imf_2_5::InputFile::~InputFile((InputFile *)local_588);
          return __return_storage_ptr__;
        }
        LogFatal<char_const(&)[50]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                   ,0x432,"Check failed: %s",
                   (char (*) [50])"pixelType == Imf::HALF || pixelType == Imf::FLOAT");
      }
      bVar16 = iVar20 == 0;
      iVar20 = iVar20 + -1;
      if (bVar16) {
        this_01 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)(ulong)p_Var29[9]._M_color;
      }
      else if (_Var47 != p_Var29[9]._M_color) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                 ,0x42d,"ReadEXR() doesn\'t currently support images with multiple channel types.");
      }
      local_4a8 = (undefined1  [8])&aStack_498;
      sVar32 = strlen((char *)(p_Var29 + 1));
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4a8,p_Var29 + 1,(long)&p_Var29[1]._M_color + sVar32);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8);
      if (local_4a8 != (undefined1  [8])&aStack_498) {
        operator_delete((void *)local_4a8,(ulong)(aStack_498._M_allocated_capacity + 1));
      }
      p_Var29 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var29);
    } while( true );
  }
  local_278 = (undefined1  [8])VVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"png","");
  bVar16 = HasExtension((string *)local_5b0,(string *)local_278);
  if ((V2f)local_278 != VVar2) {
    operator_delete((void *)local_278,auStack_268._0_8_ + 1);
  }
  if (bVar16) {
    VVar42 = (Vec2<int>)
             (encoding->
             super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             ).bits;
    ReadFileContents((string *)local_588,(string *)local_5b0);
    local_568 = VVar42;
    if (VVar42 == (Vec2<int>)0x0) {
      local_568 = ColorEncodingHandle::sRGB;
    }
    local_278 = (undefined1  [8])&PTR__LodePNGState_02d37088;
    lodepng_state_init((LodePNGState *)local_278);
    uVar39 = lodepng_inspect(&local_5b4,&local_5b8,(LodePNGState *)local_278,
                             (uchar *)CONCAT44(local_588._4_4_,local_588._0_4_),local_588._8_8_);
    if (uVar39 != 0) {
      local_4a8 = (undefined1  [8])lodepng_error_text(uVar39);
      ErrorExit<std::__cxx11::string_const&,char_const*>
                ("%s: %s",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_5b0,(char **)local_4a8);
    }
    local_548._0_8_ = (pointer)0x0;
    local_548._8_4_ = _S_red;
    auStack_538 = (undefined1  [8])pstd::pmr::new_delete_resource();
    _fStack_530 = (_Base_ptr)0x0;
    p_Stack_528 = (_Base_ptr)0x0;
    sStack_520 = 0;
    local_518.bits = 0;
    local_510._8_16_ = ZEXT416(0) << 0x40;
    local_4f8 = 0;
    local_4d8 = 0;
    local_4b8 = 0;
    local_510._0_8_ = alloc.memoryResource;
    local_4f0._0_8_ = alloc.memoryResource;
    local_4f0._8_16_ = local_510._8_16_;
    local_4d0._0_8_ = alloc.memoryResource;
    local_4d0._8_16_ = local_510._8_16_;
    if ((local_1b0 & ~LCT_GREY_ALPHA) == LCT_GREY) {
      aStack_2e8._M_allocated_capacity = 0;
      local_2f8 = (Box2i)local_510._8_16_;
      uVar22 = lodepng::decode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2f8,
                               &local_5b4,&local_5b8,
                               (uchar *)CONCAT44(local_588._4_4_,local_588._0_4_),local_588._8_8_,
                               LCT_GREY,(uint)(local_1ac == 0x10) * 8 + 8);
      uVar48 = local_5b4;
      uVar39 = local_5b8;
      if (uVar22 != 0) {
        local_4a8 = (undefined1  [8])lodepng_error_text(uVar22);
        ErrorExit<std::__cxx11::string_const&,char_const*>
                  ("%s: %s",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_5b0,(char **)local_4a8);
      }
      if (local_1ac == 0x10) {
        aaStack_398[0]._0_2_ = 0x59;
        stack0xfffffffffffffc60 = (V2f)0x1;
        auVar53._8_8_ = 0;
        auVar53._0_8_ =
             local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._0_16_ = auVar53 << 0x40;
        local_3a8._0_8_ = aaStack_398;
        AVar33.memoryResource = pstd::pmr::new_delete_resource();
        resolution_05.super_Tuple2<pbrt::Point2,_int>.y = uVar39;
        resolution_05.super_Tuple2<pbrt::Point2,_int>.x = uVar48;
        channels.n = 1;
        channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3a8;
        Image((Image *)local_4a8,Half,resolution_05,channels,(ColorEncodingHandle *)&local_5a8,
              AVar33);
        local_548._8_4_ = VStack_4a0.x;
        local_548._0_8_ = local_4a8;
        pstd::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_538,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&aStack_498);
        local_518.bits._2_6_ = lStack_478._2_6_;
        local_518.bits._0_2_ = (undefined2)lStack_478;
        pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                   local_510,
                   (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                   auStack_470);
        pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                  ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_4f0,
                   (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)auStack_450)
        ;
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                  ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_4d0,
                   (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)auStack_430);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                  ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)auStack_430);
        pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
                  ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)auStack_450)
        ;
        pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                   auStack_470);
        pstd::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&aStack_498);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._0_8_ != aaStack_398) {
          operator_delete((void *)local_3a8._0_8_,aaStack_398[0]._M_allocated_capacity + 1);
        }
        VVar42 = local_2f8.min;
        if (local_5b8 != 0) {
          uVar38 = (ulong)local_5b4;
          lVar44 = 0;
          uVar45 = 0;
          local_5b0 = (Vec2<int>)((ulong)local_568 & 0xffff000000000000);
          pGVar51 = (GammaColorEncoding *)((ulong)local_568 & 0xffffffffffff);
          uVar39 = local_5b8;
          do {
            if ((int)uVar38 == 0) {
              uVar38 = 0;
            }
            else {
              uVar50 = 0;
              local_550 = uVar45;
              do {
                uVar18 = swap_bytes(*(undefined2 *)VVar42);
                FVar55 = (float)uVar18 / 65535.0;
                if (0x1ffffffffffff < (ulong)local_568) {
                  if (local_5b0 == (Vec2<int>)0x2000000000000) {
                    FVar55 = sRGBColorEncoding::ToFloatLinear((sRGBColorEncoding *)pGVar51,FVar55);
                  }
                  else {
                    FVar55 = GammaColorEncoding::ToFloatLinear(pGVar51,FVar55);
                  }
                }
                SetChannel((Image *)local_548,(Point2i)(lVar44 + uVar50),0,FVar55);
                uVar38 = (ulong)local_5b4;
                uVar50 = uVar50 + 1;
                VVar42 = (Vec2<int>)((long)VVar42 + 2);
                uVar45 = local_550;
                uVar39 = local_5b8;
              } while (uVar50 < uVar38);
            }
            uVar45 = uVar45 + 1;
            lVar44 = lVar44 + 0x100000000;
          } while (uVar45 < uVar39);
        }
        if (VVar42 != local_2f8.max) {
          LogFatal<char_const(&)[21]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                     ,0x4bb,"Check failed: %s",(char (*) [21])"bufIter == buf.end()");
        }
      }
      else {
        aaStack_398[0]._0_2_ = 0x59;
        stack0xfffffffffffffc60 = (V2f)0x1;
        local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_568;
        local_3a8._0_8_ = aaStack_398;
        AVar33.memoryResource = pstd::pmr::new_delete_resource();
        resolution_06.super_Tuple2<pbrt::Point2,_int>.y = local_5b8;
        resolution_06.super_Tuple2<pbrt::Point2,_int>.x = local_5b4;
        channels_03.n = 1;
        channels_03.ptr =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8;
        Image((Image *)local_4a8,U256,resolution_06,channels_03,(ColorEncodingHandle *)&local_5a8,
              AVar33);
        local_548._8_4_ = VStack_4a0.x;
        local_548._0_8_ = local_4a8;
        pstd::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_538,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&aStack_498);
        local_518.bits._2_6_ = lStack_478._2_6_;
        local_518.bits._0_2_ = (undefined2)lStack_478;
        pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                   local_510,
                   (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                   auStack_470);
        pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                  ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_4f0,
                   (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)auStack_450)
        ;
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                  ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_4d0,
                   (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)auStack_430);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                  ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)auStack_430);
        pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
                  ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)auStack_450)
        ;
        pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                   auStack_470);
        pstd::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&aStack_498);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._0_8_ != aaStack_398) {
          operator_delete((void *)local_3a8._0_8_,aaStack_398[0]._M_allocated_capacity + 1);
        }
        VVar42 = local_2f8.min;
        VVar52 = local_2f8.max;
        pvVar36 = RawPointer((Image *)local_548,(Point2i)0x0);
        sVar32 = (long)VVar52 - (long)VVar42;
        if (sVar32 != 0) {
          memmove(pvVar36,(void *)VVar42,sVar32);
        }
      }
      Image(&__return_storage_ptr__->image,(Image *)local_548);
      p_Var1 = &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) =
           0;
      (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
           (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
      (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
      (__return_storage_ptr__->metadata).MSE.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).MSE.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
      (__return_storage_ptr__->metadata).colorSpace.optionalValue =
           (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
            )0x0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).colorSpace.set = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl = 0;
      *(undefined8 *)
       &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
        _M_header = 0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x34) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x3c) =
           0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue + 8) = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.set = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) =
           0;
      (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
           (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
      (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
      (__return_storage_ptr__->metadata).MSE.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).MSE.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x38) = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.set = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 4) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0xc) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x14) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x1c) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x24) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x2c) =
           0;
      (__return_storage_ptr__->metadata).renderTimeSeconds.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).renderTimeSeconds.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).renderTimeSeconds.field_0x5 = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 8) =
           0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x10) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x18) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x20) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x28) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x30) = 0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = &p_Var1->_M_header;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = &p_Var1->_M_header;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
      _M_node_count = 0;
      VVar42 = local_2f8.min;
      uVar12 = aStack_2e8._M_allocated_capacity;
    }
    else {
      local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._0_16_ = local_510._8_16_;
      uVar22 = lodepng::decode(&local_5a8,&local_5b4,&local_5b8,
                               (uchar *)CONCAT44(local_588._4_4_,local_588._0_4_),local_588._8_8_,
                               (uint)(local_1b0 == LCT_RGBA) * 4 + LCT_RGB,
                               (uint)(local_1ac == 0x10) * 8 + 8);
      uVar48 = local_5b4;
      uVar39 = local_5b8;
      if (uVar22 != 0) {
        local_4a8 = (undefined1  [8])lodepng_error_text(uVar22);
        ErrorExit<std::__cxx11::string_const&,char_const*>
                  ("%s: %s",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_5b0,(char **)local_4a8);
      }
      local_3d8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3d8._M_impl.super__Rb_tree_header._M_header;
      local_4a8[4] = 0;
      uStack_460 = uStack_460 & 0xffffff00;
      uStack_41c = uStack_41c & 0xffffff00;
      local_408 = false;
      local_3fc = false;
      local_3f4 = false;
      local_3ec = false;
      local_3d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_3d8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3e8 = RGBColorSpace::sRGB;
      local_3e0 = true;
      local_3d8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3d8._M_impl.super__Rb_tree_header._M_header._M_left;
      if (local_1ac == 0x10) {
        if (local_1b0 == LCT_RGBA) {
          local_298[0] = local_288;
          aStack_2e8._M_allocated_capacity._0_2_ = 0x52;
          local_2f8.max.x = 1;
          local_2f8.max.y = 0;
          local_2f8.min = (Vec2<int>)&aStack_2e8;
          local_2d8._M_allocated_capacity = (size_type)local_2c8;
          local_590.x = 0;
          local_590.y = 0;
          local_2c8[0] = 0x47;
          local_2d8._8_8_ = 1;
          local_2b8[0] = local_2a8;
          local_2a8[0]._0_2_ = 0x42;
          local_2b8[1] = (long *)0x1;
          local_288[0]._0_2_ = 0x41;
          local_298[1] = (long *)0x1;
          AVar33.memoryResource = pstd::pmr::new_delete_resource();
          resolution_07.super_Tuple2<pbrt::Point2,_int>.y = uVar39;
          resolution_07.super_Tuple2<pbrt::Point2,_int>.x = uVar48;
          channels_02.n = 4;
          channels_02.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8;
          Image((Image *)local_3a8,Half,resolution_07,channels_02,(ColorEncodingHandle *)&local_590,
                AVar33);
          local_548._8_4_ = local_3a8._8_4_;
          local_548._0_8_ = local_3a8._0_8_;
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_538,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)aaStack_398);
          local_518.bits = local_378.bits;
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                     local_510,&local_370);
          pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                    ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_4f0,
                     &local_350);
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                    ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_4d0,&local_330
                    );
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_330);
          pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
                    (&local_350);
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                    (&local_370);
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)aaStack_398);
          lVar44 = -0x80;
          plVar43 = local_288;
          do {
            if (plVar43 != (long *)plVar43[-2]) {
              operator_delete((long *)plVar43[-2],*plVar43 + 1);
            }
            plVar43 = plVar43 + -4;
            lVar44 = lVar44 + 0x20;
          } while (lVar44 != 0);
          VVar42 = (Vec2<int>)
                   local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (local_5b8 != 0) {
            uVar38 = (ulong)local_5b4;
            uVar50 = (ulong)local_568 & 0xffff000000000000;
            pGVar51 = (GammaColorEncoding *)((ulong)local_568 & 0xffffffffffff);
            uVar45 = 0;
            uVar39 = local_5b8;
            do {
              if ((int)uVar38 == 0) {
                uVar38 = 0;
              }
              else {
                local_300 = uVar45 << 0x20;
                uVar40 = 0;
                local_308 = uVar45;
                do {
                  if (local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish <= (ulong)VVar42) {
                    LogFatal<char_const(&)[20]>
                              (Fatal,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                               ,0x4d6,"Check failed: %s",(char (*) [20])"bufIter < buf.end()");
                  }
                  uVar18 = swap_bytes(*(undefined2 *)VVar42);
                  lVar44 = 0;
                  uVar19 = swap_bytes(*(undefined2 *)((long)VVar42 + 2));
                  local_3a8._4_4_ = (float)uVar19 / 65535.0;
                  local_3a8._0_4_ = (float)uVar18 / 65535.0;
                  uVar18 = swap_bytes(*(undefined2 *)((long)VVar42 + 4));
                  uVar19 = swap_bytes(*(undefined2 *)((long)VVar42 + 6));
                  PVar41.super_Tuple2<pbrt::Point2,_int> =
                       (Tuple2<pbrt::Point2,_int>)(uVar40 + local_300);
                  fStack_39c = (float)uVar19 / 65535.0;
                  local_3a8._8_4_ = (float)uVar18 / 65535.0;
                  local_5b0 = VVar42;
                  local_550 = uVar40;
                  do {
                    FVar55 = *(Float *)(local_3a8 + lVar44 * 4);
                    if (0x1ffffffffffff < (ulong)local_568) {
                      if (uVar50 == 0x2000000000000) {
                        FVar55 = sRGBColorEncoding::ToFloatLinear
                                           ((sRGBColorEncoding *)pGVar51,FVar55);
                      }
                      else {
                        FVar55 = GammaColorEncoding::ToFloatLinear(pGVar51,FVar55);
                      }
                    }
                    *(Float *)(local_3a8 + lVar44 * 4) = FVar55;
                    SetChannel((Image *)local_548,PVar41,(int)lVar44,FVar55);
                    lVar44 = lVar44 + 1;
                  } while (lVar44 != 4);
                  uVar38 = (ulong)local_5b4;
                  uVar40 = local_550 + 1;
                  VVar42 = (Vec2<int>)((long)local_5b0 + 8);
                  uVar45 = local_308;
                  uVar39 = local_5b8;
                } while (uVar40 < uVar38);
              }
              uVar45 = uVar45 + 1;
            } while (uVar45 < uVar39);
          }
          if (VVar42 != (Vec2<int>)
                        local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
            LogFatal<char_const(&)[21]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                       ,0x4e2,"Check failed: %s",(char (*) [21])"bufIter == buf.end()");
          }
        }
        else {
          local_2b8[0] = local_2a8;
          aStack_2e8._M_allocated_capacity._0_2_ = 0x52;
          local_2f8.max.x = 1;
          local_2f8.max.y = 0;
          local_2f8.min = (Vec2<int>)&aStack_2e8;
          local_2d8._M_allocated_capacity = (size_type)local_2c8;
          local_590.x = 0;
          local_590.y = 0;
          local_2c8[0] = 0x47;
          local_2d8._8_8_ = 1;
          local_2a8[0]._0_2_ = 0x42;
          local_2b8[1] = (long *)0x1;
          AVar33.memoryResource = pstd::pmr::new_delete_resource();
          resolution_10.super_Tuple2<pbrt::Point2,_int>.y = uVar39;
          resolution_10.super_Tuple2<pbrt::Point2,_int>.x = uVar48;
          channels_08.n = 3;
          channels_08.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8;
          Image((Image *)local_3a8,Half,resolution_10,channels_08,(ColorEncodingHandle *)&local_590,
                AVar33);
          local_548._8_4_ = local_3a8._8_4_;
          local_548._0_8_ = local_3a8._0_8_;
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_538,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)aaStack_398);
          local_518.bits = local_378.bits;
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                     local_510,&local_370);
          pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                    ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_4f0,
                     &local_350);
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                    ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_4d0,&local_330
                    );
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_330);
          pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
                    (&local_350);
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                    (&local_370);
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)aaStack_398);
          lVar44 = -0x60;
          plVar43 = local_2a8;
          do {
            if (plVar43 != (long *)plVar43[-2]) {
              operator_delete((long *)plVar43[-2],*plVar43 + 1);
            }
            plVar43 = plVar43 + -4;
            lVar44 = lVar44 + 0x20;
          } while (lVar44 != 0);
          VVar42 = (Vec2<int>)
                   local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (local_5b8 != 0) {
            uVar38 = (ulong)local_5b4;
            uVar50 = (ulong)local_568 & 0xffff000000000000;
            pGVar51 = (GammaColorEncoding *)((ulong)local_568 & 0xffffffffffff);
            uVar45 = 0;
            uVar39 = local_5b8;
            do {
              if ((int)uVar38 == 0) {
                uVar38 = 0;
              }
              else {
                local_300 = uVar45 << 0x20;
                uVar40 = 0;
                local_308 = uVar45;
                do {
                  if (local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish <= (ulong)VVar42) {
                    LogFatal<char_const(&)[20]>
                              (Fatal,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                               ,0x4e8,"Check failed: %s",(char (*) [20])"bufIter < buf.end()");
                  }
                  uVar18 = swap_bytes(*(undefined2 *)VVar42);
                  lVar44 = 0;
                  uVar19 = swap_bytes(*(undefined2 *)((long)VVar42 + 2));
                  local_3a8._4_4_ = (float)uVar19 / 65535.0;
                  local_3a8._0_4_ = (float)uVar18 / 65535.0;
                  uVar18 = swap_bytes(*(undefined2 *)((long)VVar42 + 4));
                  PVar41.super_Tuple2<pbrt::Point2,_int> =
                       (Tuple2<pbrt::Point2,_int>)(uVar40 + local_300);
                  local_3a8._8_4_ = (float)uVar18 / 65535.0;
                  local_5b0 = VVar42;
                  local_550 = uVar40;
                  do {
                    FVar55 = *(Float *)(local_3a8 + lVar44 * 4);
                    if (0x1ffffffffffff < (ulong)local_568) {
                      if (uVar50 == 0x2000000000000) {
                        FVar55 = sRGBColorEncoding::ToFloatLinear
                                           ((sRGBColorEncoding *)pGVar51,FVar55);
                      }
                      else {
                        FVar55 = GammaColorEncoding::ToFloatLinear(pGVar51,FVar55);
                      }
                    }
                    *(Float *)(local_3a8 + lVar44 * 4) = FVar55;
                    SetChannel((Image *)local_548,PVar41,(int)lVar44,FVar55);
                    lVar44 = lVar44 + 1;
                  } while (lVar44 != 3);
                  uVar38 = (ulong)local_5b4;
                  uVar40 = local_550 + 1;
                  VVar42 = (Vec2<int>)((long)local_5b0 + 6);
                  uVar45 = local_308;
                  uVar39 = local_5b8;
                } while (uVar40 < uVar38);
              }
              uVar45 = uVar45 + 1;
            } while (uVar45 < uVar39);
          }
          if (VVar42 != (Vec2<int>)
                        local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
            LogFatal<char_const(&)[21]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                       ,0x4f3,"Check failed: %s",(char (*) [21])"bufIter == buf.end()");
          }
        }
      }
      else {
        if (local_1b0 == LCT_RGBA) {
          local_2d8._M_allocated_capacity = (size_type)local_2c8;
          local_2b8[0] = local_2a8;
          local_298[0] = local_288;
          aStack_2e8._M_allocated_capacity._0_2_ = 0x52;
          local_2f8.max.x = 1;
          local_2f8.max.y = 0;
          local_2f8.min = (Vec2<int>)&aStack_2e8;
          local_2c8[0] = 0x47;
          local_2d8._8_8_ = 1;
          local_2a8[0]._0_2_ = 0x42;
          local_2b8[1] = (long *)0x1;
          local_288[0]._0_2_ = 0x41;
          local_298[1] = (long *)0x1;
          local_590 = local_568;
          AVar33.memoryResource = pstd::pmr::new_delete_resource();
          resolution_09.super_Tuple2<pbrt::Point2,_int>.y = local_5b8;
          resolution_09.super_Tuple2<pbrt::Point2,_int>.x = local_5b4;
          channels_05.n = 4;
          channels_05.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8;
          Image((Image *)local_3a8,U256,resolution_09,channels_05,(ColorEncodingHandle *)&local_590,
                AVar33);
          local_548._8_4_ = local_3a8._8_4_;
          local_548._0_8_ = local_3a8._0_8_;
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_538,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)aaStack_398);
          local_518.bits = local_378.bits;
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                     local_510,&local_370);
          pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                    ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_4f0,
                     &local_350);
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                    ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_4d0,&local_330
                    );
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_330);
          pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
                    (&local_350);
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                    (&local_370);
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)aaStack_398);
          lVar44 = -0x80;
          plVar43 = local_288;
          do {
            if (plVar43 != (long *)plVar43[-2]) {
              operator_delete((long *)plVar43[-2],*plVar43 + 1);
            }
            plVar43 = plVar43 + -4;
            lVar44 = lVar44 + 0x20;
          } while (lVar44 != 0);
          VVar42 = (Vec2<int>)
                   local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          VVar52 = (Vec2<int>)
                   local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pvVar36 = RawPointer((Image *)local_548,(Point2i)0x0);
        }
        else {
          local_2d8._M_allocated_capacity = (size_type)local_2c8;
          local_2b8[0] = local_2a8;
          aStack_2e8._M_allocated_capacity._0_2_ = 0x52;
          local_2f8.max.x = 1;
          local_2f8.max.y = 0;
          local_2f8.min = (Vec2<int>)&aStack_2e8;
          local_2c8[0] = 0x47;
          local_2d8._8_8_ = 1;
          local_2a8[0]._0_2_ = 0x42;
          local_2b8[1] = (long *)0x1;
          local_590 = local_568;
          AVar33.memoryResource = pstd::pmr::new_delete_resource();
          resolution_11.super_Tuple2<pbrt::Point2,_int>.y = local_5b8;
          resolution_11.super_Tuple2<pbrt::Point2,_int>.x = local_5b4;
          channels_09.n = 3;
          channels_09.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8;
          Image((Image *)local_3a8,U256,resolution_11,channels_09,(ColorEncodingHandle *)&local_590,
                AVar33);
          local_548._8_4_ = local_3a8._8_4_;
          local_548._0_8_ = local_3a8._0_8_;
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_538,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)aaStack_398);
          local_518.bits = local_378.bits;
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                     local_510,&local_370);
          pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                    ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_4f0,
                     &local_350);
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                    ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_4d0,&local_330
                    );
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_330);
          pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
                    (&local_350);
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                    (&local_370);
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)aaStack_398);
          lVar44 = -0x60;
          plVar43 = local_2a8;
          do {
            if (plVar43 != (long *)plVar43[-2]) {
              operator_delete((long *)plVar43[-2],*plVar43 + 1);
            }
            plVar43 = plVar43 + -4;
            lVar44 = lVar44 + 0x20;
          } while (lVar44 != 0);
          VVar42 = (Vec2<int>)
                   local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          VVar52 = (Vec2<int>)
                   local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pvVar36 = RawPointer((Image *)local_548,(Point2i)0x0);
        }
        if ((long)VVar52 - (long)VVar42 != 0) {
          memmove(pvVar36,(void *)VVar42,(long)VVar52 - (long)VVar42);
        }
      }
      Image(&__return_storage_ptr__->image,(Image *)local_548);
      (__return_storage_ptr__->metadata).renderTimeSeconds.set = (bool)local_4a8[4];
      if ((bool)local_4a8[4] == true) {
        (__return_storage_ptr__->metadata).renderTimeSeconds.optionalValue =
             (aligned_storage_t<sizeof(float),_alignof(float)>)local_4a8._0_4_;
      }
      (__return_storage_ptr__->metadata).cameraFromWorld.set = uStack_460._0_1_;
      if (uStack_460._0_1_ == true) {
        *(V2f *)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue = VStack_4a0;
        *(size_type *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 8)
             = aStack_498._M_allocated_capacity;
        pVVar8 = (V2f *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue +
                        0x10);
        pVVar8->x = (float)aStack_498._8_4_;
        pVVar8->y = (float)aStack_498._12_4_;
        *(long **)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x18) =
             plStack_488;
        *(size_t *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x20)
             = sStack_480;
        *(ulong *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x28) =
             CONCAT62(lStack_478._2_6_,(undefined2)lStack_478);
        *(undefined1 (*) [8])
         ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x30) =
             auStack_470;
        *(long **)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x38) =
             plStack_468;
      }
      (__return_storage_ptr__->metadata).NDCFromWorld.set = uStack_41c._0_1_;
      if (uStack_41c._0_1_ == true) {
        *(ulong *)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue =
             CONCAT26(uStack_458._2_2_,CONCAT24((undefined2)uStack_458,uStack_45c));
        *(ulong *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 8) =
             CONCAT44(auStack_450._0_4_,uStack_458._4_4_);
        *(ulong *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x10) =
             CONCAT44((undefined4)uStack_448,auStack_450._4_4_);
        *(ulong *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x18) =
             CONCAT44(uStack_440,uStack_448._4_4_);
        *(ulong *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x20) =
             CONCAT26(uStack_436,CONCAT24(HStack_438.h,uStack_43c));
        *(ulong *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x28) =
             CONCAT44(auStack_430._0_4_,uStack_434);
        *(ulong *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x30) =
             CONCAT44(auStack_430._8_4_,auStack_430._4_4_);
        *(ulong *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x38) =
             CONCAT44(auStack_430._16_4_,auStack_430._12_4_);
      }
      (__return_storage_ptr__->metadata).pixelBounds.set = local_408;
      if (local_408 == true) {
        *(size_t *)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue = sStack_418;
        *(undefined8 *)((long)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue + 8) =
             uStack_410;
      }
      (__return_storage_ptr__->metadata).fullResolution.set = local_3fc;
      if (local_3fc == true) {
        (__return_storage_ptr__->metadata).fullResolution.optionalValue = local_404;
      }
      (__return_storage_ptr__->metadata).samplesPerPixel.set = local_3f4;
      if (local_3f4 == true) {
        (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue = local_3f8;
      }
      (__return_storage_ptr__->metadata).MSE.set = local_3ec;
      if (local_3ec == true) {
        (__return_storage_ptr__->metadata).MSE.optionalValue = local_3f0;
      }
      (__return_storage_ptr__->metadata).colorSpace.set = local_3e0;
      if (local_3e0 == true) {
        (__return_storage_ptr__->metadata).colorSpace.optionalValue = local_3e8;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::_Rb_tree(&(__return_storage_ptr__->metadata).stringVectors._M_t,&local_3d8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_3d8);
      VVar42 = (Vec2<int>)
               local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar12 = local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    if (VVar42 != (Vec2<int>)0x0) {
      operator_delete((void *)VVar42,uVar12 - (long)VVar42);
    }
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_4d0);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
              ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_4f0);
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)local_510)
    ;
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_538);
    if ((undefined1 *)CONCAT44(local_588._4_4_,local_588._0_4_) == local_588 + 0x10) {
      return __return_storage_ptr__;
    }
    operator_delete((undefined1 *)CONCAT44(local_588._4_4_,local_588._0_4_),local_588._16_8_ + 1);
    return __return_storage_ptr__;
  }
  local_278 = (undefined1  [8])VVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"pfm","");
  bVar16 = HasExtension((string *)local_5b0,(string *)local_278);
  if ((V2f)local_278 != VVar2) {
    operator_delete((void *)local_278,auStack_268._0_8_ + 1);
  }
  if (bVar16) {
    local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1a8[0]._M_impl.super__Rb_tree_header._M_header;
    aaStack_398[0]._8_4_ = 0.0;
    aaStack_398[0]._12_4_ = 0.0;
    local_278[4] = 0;
    local_230 = local_230 & 0xffffff00;
    local_1ec = 0;
    local_1d8 = false;
    local_1cc = false;
    local_1c4 = false;
    local_1bc = false;
    local_1b0 = local_1b0 & 0xffffff00;
    local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1a8[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
    stack0xfffffffffffffc60 = ZEXT816(0);
    local_3a8._0_8_ = alloc.memoryResource;
    local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_left;
    __stream = fopen(*(char **)local_5b0,"rb");
    if (__stream == (FILE *)0x0) {
      pcVar31 = "%s: unable to open PFM file";
    }
    else {
      iVar20 = readWord((FILE *)__stream,local_548,bufferLength);
      if (iVar20 == -1) {
        pcVar31 = "%s: unable to read PFM file";
      }
      else {
        bVar16 = local_548[2] == U256 >> 0x10 && (ushort)local_548._0_8_ == 0x6650;
        if (bVar16) {
          uVar39 = 1;
          uVar18 = 0;
        }
        else {
          uVar39 = 3;
          uVar18 = (ushort)(byte)local_548[2] | (ushort)local_548._0_8_ ^ 18000;
          if (uVar18 != 0) {
            ErrorExit<std::__cxx11::string_const&,char&,char&>
                      ("%s: unable to decode PFM file type \"%c%c\"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5b0,local_548,local_548 + 1);
          }
        }
        pfVar35 = (float *)(ulong)uVar18;
        iVar20 = readWord((FILE *)__stream,local_548,bufferLength_00);
        if (iVar20 != -1) {
          ppVar37 = (pbrt *)strlen(local_548);
          str._M_str = local_588;
          str._M_len = (size_t)local_548;
          bVar17 = Atoi(ppVar37,str,(int *)pfVar35);
          if (!bVar17) {
            pcVar31 = "%s: unable to decode width \"%s\"";
LAB_0023f187:
            ErrorExit<std::__cxx11::string_const&,char(&)[80]>
                      (pcVar31,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5b0,(char (*) [80])local_548);
          }
          iVar20 = readWord((FILE *)__stream,local_548,bufferLength_01);
          if (iVar20 != -1) {
            ppVar37 = (pbrt *)strlen(local_548);
            str_00._M_str = (char *)&local_5a8;
            str_00._M_len = (size_t)local_548;
            bVar17 = Atoi(ppVar37,str_00,(int *)pfVar35);
            if (!bVar17) {
              pcVar31 = "%s: unable to decode height \"%s\"";
              goto LAB_0023f187;
            }
            iVar20 = readWord((FILE *)__stream,local_548,bufferLength_02);
            if (iVar20 != -1) {
              ppVar37 = (pbrt *)strlen(local_548);
              str_01._M_str = (char *)&local_590;
              str_01._M_len = (size_t)local_548;
              bVar17 = Atof(ppVar37,str_01,pfVar35);
              if (!bVar17) {
                pcVar31 = "%s: unable to decode scale \"%s\"";
                goto LAB_0023f187;
              }
              uVar48 = local_588._0_4_ * uVar39 *
                       (int)local_5a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
              uVar45 = (ulong)uVar48;
              pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::resize
                        ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_3a8,uVar45
                        );
              iVar20 = (int)local_5a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
              do {
                VVar42 = local_5b0;
                if (iVar20 < 1) {
                  if ((uVar45 != 0) && (0.0 <= (float)local_590.x)) {
                    uVar38 = 0;
                    do {
                      fVar3 = (float)swap_bytes(*(float *)((long)stack0xfffffffffffffc60 +
                                                          uVar38 * 4));
                      *(float *)((long)stack0xfffffffffffffc60 + uVar38 * 4) = fVar3;
                      uVar38 = uVar38 + 1;
                    } while (uVar45 != uVar38);
                  }
                  if (uVar48 != 0) {
                    auVar6._8_4_ = 0x7fffffff;
                    auVar6._0_8_ = 0x7fffffff7fffffff;
                    auVar6._12_4_ = 0x7fffffff;
                    auVar53 = vandps_avx512vl(ZEXT416((uint)local_590.x),auVar6);
                    if ((auVar53._0_4_ != 1.0) || (NAN(auVar53._0_4_))) {
                      auVar56._8_4_ = 0x7fffffff;
                      auVar56._0_8_ = 0x7fffffff7fffffff;
                      auVar56._12_4_ = 0x7fffffff;
                      uVar38 = 0;
                      do {
                        auVar53 = vandps_avx(ZEXT416((uint)local_590.x),auVar56);
                        *(float *)((long)stack0xfffffffffffffc60 + uVar38 * 4) =
                             auVar53._0_4_ * *(float *)((long)stack0xfffffffffffffc60 + uVar38 * 4);
                        uVar38 = uVar38 + 1;
                      } while (uVar45 != uVar38);
                    }
                  }
                  fclose(__stream);
                  if (LOGGING_LogLevel < 1) {
                    VStack_4a0 = (V2f)0x0;
                    aStack_498._M_allocated_capacity =
                         aStack_498._M_allocated_capacity & 0xffffffffffffff00;
                    local_4a8 = (undefined1  [8])&aStack_498;
                    detail::stringPrintfRecursive<std::__cxx11::string_const&,int&,int&>
                              ((string *)local_4a8,"Read PFM image %s (%d x %d)",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               VVar42,(int *)local_588,(int *)&local_5a8);
                    Log(Verbose,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                        ,0x5e1,(char *)local_4a8);
                    if (local_4a8 != (undefined1  [8])&aStack_498) {
                      operator_delete((void *)local_4a8,
                                      (ulong)(aStack_498._M_allocated_capacity + 1));
                    }
                  }
                  uVar12 = aaStack_398[0]._8_8_;
                  local_1b8 = RGBColorSpace::sRGB;
                  local_1b0 = CONCAT31(local_1b0._1_3_,1);
                  if (bVar16) {
                    pvVar46 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_4a8;
                    local_4a8 = (undefined1  [8])local_3a8._0_8_;
                    aaStack_398[0]._8_8_ = 0;
                    aStack_2e8._M_allocated_capacity._0_2_ = 0x59;
                    local_2f8.max.x = 1;
                    local_2f8.max.y = 0;
                    local_2f8.min = (Vec2<int>)&aStack_2e8;
                    aStack_498._M_allocated_capacity = aaStack_398[0]._M_allocated_capacity;
                    aStack_498._8_8_ = uVar12;
                    VStack_4a0 = stack0xfffffffffffffc60;
                    resolution_01.super_Tuple2<pbrt::Point2,_int>.y =
                         (int)local_5a8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    resolution_01.super_Tuple2<pbrt::Point2,_int>.x = local_588._0_4_;
                    channels_07.n = 1;
                    channels_07.ptr =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_2f8;
                    unique0x1000c570 = ZEXT816(0) << 0x20;
                    Image(&__return_storage_ptr__->image,pvVar46,resolution_01,channels_07);
                    (__return_storage_ptr__->metadata).renderTimeSeconds.set = (bool)local_278[4];
                    if ((bool)local_278[4] == true) {
                      (__return_storage_ptr__->metadata).renderTimeSeconds.optionalValue =
                           (aligned_storage_t<sizeof(float),_alignof(float)>)local_278._0_4_;
                    }
                    (__return_storage_ptr__->metadata).cameraFromWorld.set = local_230._0_1_;
                    if (local_230._0_1_ == true) {
                      *(undefined1 (*) [8])
                       &(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue =
                           auStack_270;
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 8)
                           = auStack_268._0_8_;
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue +
                       0x10) = auStack_268._8_8_;
                      *(undefined1 **)
                       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue +
                       0x18) = puStack_258;
                      *(size_t *)
                       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue +
                       0x20) = sStack_250;
                      ((TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                        *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue +
                          0x28))->bits = TStack_248.bits;
                      *(undefined1 (*) [8])
                       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue +
                       0x30) = auStack_240;
                      *(long **)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.
                                        optionalValue + 0x38) = plStack_238;
                    }
                    (__return_storage_ptr__->metadata).NDCFromWorld.set = (bool)local_1ec;
                    if ((bool)local_1ec == true) {
                      *(ulong *)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue =
                           CONCAT26(uStack_228._2_2_,CONCAT24((undefined2)uStack_228,uStack_22c));
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 8) =
                           stack0xfffffffffffffddc;
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x10)
                           = vStack_220._4_8_;
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x18)
                           = vStack_220._12_8_;
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x20)
                           = vStack_220._20_8_;
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x28)
                           = stack0xfffffffffffffdfc;
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x30)
                           = auStack_200._4_8_;
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x38)
                           = auStack_200._12_8_;
                    }
                    (__return_storage_ptr__->metadata).pixelBounds.set = local_1d8;
                    if (local_1d8 == true) {
                      *(size_t *)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue =
                           local_1e8;
                      *(uchar **)
                       ((long)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue + 8) =
                           puStack_1e0;
                    }
                    (__return_storage_ptr__->metadata).fullResolution.set = local_1cc;
                    if (local_1cc == true) {
                      (__return_storage_ptr__->metadata).fullResolution.optionalValue = local_1d4;
                    }
                    (__return_storage_ptr__->metadata).samplesPerPixel.set = local_1c4;
                    if (local_1c4 == true) {
                      (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue = local_1c8;
                    }
                    (__return_storage_ptr__->metadata).MSE.set = local_1bc;
                    if (local_1bc == true) {
                      (__return_storage_ptr__->metadata).MSE.optionalValue = local_1c0;
                    }
                    (__return_storage_ptr__->metadata).colorSpace.set = (bool)(undefined1)local_1b0;
                    if ((bool)(undefined1)local_1b0 == true) {
                      (__return_storage_ptr__->metadata).colorSpace.optionalValue = local_1b8;
                    }
                    std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    ::_Rb_tree(&(__return_storage_ptr__->metadata).stringVectors._M_t,local_1a8);
                    if (local_2f8.min != (Vec2<int>)&aStack_2e8) {
                      operator_delete((void *)local_2f8.min,aStack_2e8._M_allocated_capacity + 1);
                    }
                  }
                  else {
                    pvVar46 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&local_2f8;
                    plStack_468 = &uStack_458;
                    aaStack_398[0]._8_8_ = 0;
                    aStack_2e8._M_allocated_capacity = aaStack_398[0]._M_allocated_capacity;
                    aStack_2e8._8_8_ = uVar12;
                    local_2f8.max.x = local_3a8._8_4_;
                    local_2f8.max.y = (int)fStack_39c;
                    local_2f8.min.x = local_3a8._0_4_;
                    local_2f8.min.y = local_3a8._4_4_;
                    register0x00001200 = ZEXT816(0) << 0x20;
                    local_4a8 = (undefined1  [8])&aStack_498;
                    aStack_498._M_allocated_capacity._0_2_ = 0x52;
                    VStack_4a0.x = 1.4013e-45;
                    VStack_4a0.y = 0.0;
                    plStack_488 = &lStack_478;
                    lStack_478._0_2_ = 0x47;
                    sStack_480 = 1;
                    uStack_458._0_2_ = 0x42;
                    uStack_460 = 1;
                    uStack_45c = 0;
                    resolution_00.super_Tuple2<pbrt::Point2,_int>.y =
                         (int)local_5a8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    resolution_00.super_Tuple2<pbrt::Point2,_int>.x = local_588._0_4_;
                    channels_06.n = 3;
                    channels_06.ptr =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4a8;
                    Image(&__return_storage_ptr__->image,pvVar46,resolution_00,channels_06);
                    (__return_storage_ptr__->metadata).renderTimeSeconds.set = (bool)local_278[4];
                    if ((bool)local_278[4] == true) {
                      (__return_storage_ptr__->metadata).renderTimeSeconds.optionalValue =
                           (aligned_storage_t<sizeof(float),_alignof(float)>)local_278._0_4_;
                    }
                    (__return_storage_ptr__->metadata).cameraFromWorld.set = local_230._0_1_;
                    if (local_230._0_1_ == true) {
                      *(undefined1 (*) [8])
                       &(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue =
                           auStack_270;
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 8)
                           = auStack_268._0_8_;
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue +
                       0x10) = auStack_268._8_8_;
                      *(undefined1 **)
                       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue +
                       0x18) = puStack_258;
                      *(size_t *)
                       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue +
                       0x20) = sStack_250;
                      ((TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                        *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue +
                          0x28))->bits = TStack_248.bits;
                      *(undefined1 (*) [8])
                       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue +
                       0x30) = auStack_240;
                      *(long **)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.
                                        optionalValue + 0x38) = plStack_238;
                    }
                    (__return_storage_ptr__->metadata).NDCFromWorld.set = (bool)local_1ec;
                    if ((bool)local_1ec == true) {
                      *(ulong *)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue =
                           CONCAT26(uStack_228._2_2_,CONCAT24((undefined2)uStack_228,uStack_22c));
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 8) =
                           stack0xfffffffffffffddc;
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x10)
                           = vStack_220._4_8_;
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x18)
                           = vStack_220._12_8_;
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x20)
                           = vStack_220._20_8_;
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x28)
                           = stack0xfffffffffffffdfc;
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x30)
                           = auStack_200._4_8_;
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x38)
                           = auStack_200._12_8_;
                    }
                    (__return_storage_ptr__->metadata).pixelBounds.set = local_1d8;
                    if (local_1d8 == true) {
                      *(size_t *)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue =
                           local_1e8;
                      *(uchar **)
                       ((long)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue + 8) =
                           puStack_1e0;
                    }
                    (__return_storage_ptr__->metadata).fullResolution.set = local_1cc;
                    if (local_1cc == true) {
                      (__return_storage_ptr__->metadata).fullResolution.optionalValue = local_1d4;
                    }
                    (__return_storage_ptr__->metadata).samplesPerPixel.set = local_1c4;
                    if (local_1c4 == true) {
                      (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue = local_1c8;
                    }
                    (__return_storage_ptr__->metadata).MSE.set = local_1bc;
                    if (local_1bc == true) {
                      (__return_storage_ptr__->metadata).MSE.optionalValue = local_1c0;
                    }
                    (__return_storage_ptr__->metadata).colorSpace.set = (bool)(undefined1)local_1b0;
                    if ((bool)(undefined1)local_1b0 == true) {
                      (__return_storage_ptr__->metadata).colorSpace.optionalValue = local_1b8;
                    }
                    std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    ::_Rb_tree(&(__return_storage_ptr__->metadata).stringVectors._M_t,local_1a8);
                    lVar44 = -0x60;
                    plVar43 = &uStack_458;
                    do {
                      if (plVar43 != (long *)plVar43[-2]) {
                        operator_delete((long *)plVar43[-2],*plVar43 + 1);
                      }
                      plVar43 = plVar43 + -4;
                      lVar44 = lVar44 + 0x20;
                    } while (lVar44 != 0);
                  }
                  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(pvVar46);
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::~_Rb_tree(local_1a8);
                  goto LAB_0023ee69;
                }
                iVar20 = iVar20 + -1;
                sVar32 = fread((float *)((long)stack0xfffffffffffffc60 +
                                        (long)(int)(local_588._0_4_ * uVar39 * iVar20) * 4),4,
                               (long)(int)(local_588._0_4_ * uVar39),__stream);
              } while (sVar32 == (long)(int)local_588._0_4_ * (ulong)uVar39);
            }
          }
        }
        fclose(__stream);
        pcVar31 = "%s: premature end of file in PFM file";
      }
    }
    ErrorExit<std::__cxx11::string_const&>
              (pcVar31,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5b0);
  }
  local_278 = (undefined1  [8])VVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"hdr","");
  bVar16 = HasExtension((string *)local_5b0,(string *)local_278);
  if ((V2f)local_278 != VVar2) {
    operator_delete((void *)local_278,auStack_268._0_8_ + 1);
  }
  if (!bVar16) {
    first = stbi_load(*(char **)local_5b0,(int *)&local_2f8,(int *)local_588,(int *)&local_5a8,0);
    if (first == (stbi_uc *)0x0) {
      ErrorExit<std::__cxx11::string_const&>
                ("%s: no support for reading images with this extension",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0);
    }
    local_278 = (undefined1  [8])alloc.memoryResource;
    pstd::vector<unsigned_char,pstd::pmr::polymorphic_allocator<unsigned_char>>::
    vector<unsigned_char*>
              ((vector<unsigned_char,pstd::pmr::polymorphic_allocator<unsigned_char>> *)local_3a8,
               first,first + (long)(int)local_5a8.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start *
                             (long)(int)local_588._0_4_ * (long)local_2f8.min.x,
               (polymorphic_allocator<unsigned_char> *)local_278);
    stbi_image_free(first);
    uVar12 = aaStack_398[0]._8_8_;
    switch((int)local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start) {
    case 1:
      aaStack_398[0]._8_8_ = 0;
      local_50.alloc.memoryResource = (memory_resource *)local_3a8._0_8_;
      local_50.ptr = (uchar *)stack0xfffffffffffffc60;
      local_50.nAlloc = aaStack_398[0]._M_allocated_capacity;
      local_50.nStored = uVar12;
      register0x00001200 = ZEXT816(0) << 0x20;
      local_278 = (undefined1  [8])VVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Y","");
      resolution_08.super_Tuple2<pbrt::Point2,_int>.y = local_588._0_4_;
      resolution_08.super_Tuple2<pbrt::Point2,_int>.x = local_2f8.min.x;
      local_58 = ColorEncodingHandle::sRGB;
      channels_04.n = 1;
      channels_04.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278;
      Image(&__return_storage_ptr__->image,&local_50,resolution_08,channels_04,
            (ColorEncodingHandle *)&local_58);
      p_Var1 = &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) =
           0;
      (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
           (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
      (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
      (__return_storage_ptr__->metadata).MSE.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).MSE.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
      (__return_storage_ptr__->metadata).colorSpace.optionalValue =
           (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
            )0x0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).colorSpace.set = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl = 0;
      *(undefined8 *)
       &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
        _M_header = 0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x34) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x3c) =
           0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue + 8) = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.set = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) =
           0;
      (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
           (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
      (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
      (__return_storage_ptr__->metadata).MSE.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).MSE.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x38) = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.set = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 4) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0xc) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x14) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x1c) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x24) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x2c) =
           0;
      (__return_storage_ptr__->metadata).renderTimeSeconds.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).renderTimeSeconds.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).renderTimeSeconds.field_0x5 = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 8) =
           0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x10) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x18) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x20) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x28) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x30) = 0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = &p_Var1->_M_header;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = &p_Var1->_M_header;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
      _M_node_count = 0;
      if ((V2f)local_278 != VVar2) {
        operator_delete((void *)local_278,auStack_268._0_8_ + 1);
      }
      this_00 = &local_50;
      break;
    case 2:
      local_4a8 = (undefined1  [8])&aStack_498;
      aaStack_398[0]._8_8_ = 0;
      local_78.alloc.memoryResource = (memory_resource *)local_3a8._0_8_;
      local_78.ptr = (uchar *)stack0xfffffffffffffc60;
      local_78.nAlloc = aaStack_398[0]._M_allocated_capacity;
      local_78.nStored = uVar12;
      register0x00001200 = ZEXT816(0) << 0x20;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"Y","");
      plVar43 = &lStack_478;
      plStack_488 = plVar43;
      std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_488,"A","");
      resolution_12.super_Tuple2<pbrt::Point2,_int>.y = local_588._0_4_;
      resolution_12.super_Tuple2<pbrt::Point2,_int>.x = local_2f8.min.x;
      local_80 = ColorEncodingHandle::sRGB;
      channels_15.n = 2;
      channels_15.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8;
      Image((Image *)local_278,&local_78,resolution_12,channels_15,(ColorEncodingHandle *)&local_80)
      ;
      lVar44 = -0x40;
      do {
        if (plVar43 != (long *)plVar43[-2]) {
          operator_delete((long *)plVar43[-2],*plVar43 + 1);
        }
        plVar43 = plVar43 + -4;
        lVar44 = lVar44 + 0x20;
      } while (lVar44 != 0);
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                (&local_78);
      local_548._0_8_ = auStack_538;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"Y","");
      requestedChannels_02.n = 1;
      requestedChannels_02.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548;
      GetChannelDesc((ImageChannelDesc *)local_4a8,(Image *)local_278,requestedChannels_02);
      AVar33.memoryResource = pstd::pmr::new_delete_resource();
      SelectChannels(&__return_storage_ptr__->image,(Image *)local_278,(ImageChannelDesc *)local_4a8
                     ,AVar33);
      p_Var1 = &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) =
           0;
      (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
           (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
      (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
      (__return_storage_ptr__->metadata).MSE.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).MSE.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
      (__return_storage_ptr__->metadata).colorSpace.optionalValue =
           (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
            )0x0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).colorSpace.set = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl = 0;
      *(undefined8 *)
       &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
        _M_header = 0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x34) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x3c) =
           0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue + 8) = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.set = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) =
           0;
      (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
           (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
      (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
      (__return_storage_ptr__->metadata).MSE.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).MSE.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x38) = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.set = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 4) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0xc) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x14) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x1c) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x24) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x2c) =
           0;
      (__return_storage_ptr__->metadata).renderTimeSeconds.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).renderTimeSeconds.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).renderTimeSeconds.field_0x5 = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 8) =
           0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x10) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x18) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x20) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x28) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x30) = 0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = &p_Var1->_M_header;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = &p_Var1->_M_header;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
      _M_node_count = 0;
      InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)local_4a8);
      if ((undefined1 *)local_548._0_8_ != auStack_538) {
        operator_delete((void *)local_548._0_8_,(long)auStack_538 + 1);
      }
      goto LAB_0023f058;
    case 3:
      aaStack_398[0]._8_8_ = 0;
      local_a0.alloc.memoryResource = (memory_resource *)local_3a8._0_8_;
      local_a0.ptr = (uchar *)stack0xfffffffffffffc60;
      local_a0.nAlloc = aaStack_398[0]._M_allocated_capacity;
      local_a0.nStored = uVar12;
      register0x00001200 = ZEXT816(0) << 0x20;
      local_278 = (undefined1  [8])VVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"R","");
      puStack_258 = auStack_270 + 0x28;
      std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_270 + 0x18),"G","");
      plVar43 = &uStack_228;
      plStack_238 = plVar43;
      std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_270 + 0x38),"B","");
      resolution_13.super_Tuple2<pbrt::Point2,_int>.y = local_588._0_4_;
      resolution_13.super_Tuple2<pbrt::Point2,_int>.x = local_2f8.min.x;
      local_a8 = ColorEncodingHandle::sRGB;
      channels_11.n = 3;
      channels_11.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278;
      Image(&__return_storage_ptr__->image,&local_a0,resolution_13,channels_11,
            (ColorEncodingHandle *)&local_a8);
      lVar44 = -0x60;
      p_Var1 = &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) =
           0;
      (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
           (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
      (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
      (__return_storage_ptr__->metadata).MSE.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).MSE.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
      (__return_storage_ptr__->metadata).colorSpace.optionalValue =
           (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
            )0x0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).colorSpace.set = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl = 0;
      *(undefined8 *)
       &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
        _M_header = 0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x34) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x3c) =
           0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue + 8) = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.set = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) =
           0;
      (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
           (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
      (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
      (__return_storage_ptr__->metadata).MSE.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).MSE.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x38) = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.set = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 4) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0xc) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x14) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x1c) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x24) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x2c) =
           0;
      (__return_storage_ptr__->metadata).renderTimeSeconds.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).renderTimeSeconds.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).renderTimeSeconds.field_0x5 = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 8) =
           0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x10) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x18) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x20) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x28) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x30) = 0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = &p_Var1->_M_header;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = &p_Var1->_M_header;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
      _M_node_count = 0;
      do {
        if (plVar43 != (long *)plVar43[-2]) {
          operator_delete((long *)plVar43[-2],*plVar43 + 1);
        }
        plVar43 = plVar43 + -4;
        lVar44 = lVar44 + 0x20;
      } while (lVar44 != 0);
      this_00 = &local_a0;
      break;
    case 4:
      local_4a8 = (undefined1  [8])&aStack_498;
      aaStack_398[0]._8_8_ = 0;
      local_c8.alloc.memoryResource = (memory_resource *)local_3a8._0_8_;
      local_c8.ptr = (uchar *)stack0xfffffffffffffc60;
      local_c8.nAlloc = aaStack_398[0]._M_allocated_capacity;
      local_c8.nStored = uVar12;
      register0x00001200 = ZEXT816(0) << 0x20;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"R","");
      plStack_488 = &lStack_478;
      std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_488,"G","");
      plVar43 = &uStack_458;
      plStack_468 = plVar43;
      std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_468,"B","");
      pHVar49 = &HStack_438;
      uStack_448 = pHVar49;
      std::__cxx11::string::_M_construct<char_const*>((string *)&uStack_448,"A","");
      resolution_14.super_Tuple2<pbrt::Point2,_int>.y = local_588._0_4_;
      resolution_14.super_Tuple2<pbrt::Point2,_int>.x = local_2f8.min.x;
      local_d0 = ColorEncodingHandle::sRGB;
      channels_13.n = 4;
      channels_13.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8;
      Image((Image *)local_278,&local_c8,resolution_14,channels_13,(ColorEncodingHandle *)&local_d0)
      ;
      lVar44 = -0x80;
      do {
        if (pHVar49 != *(Half **)(pHVar49 + -8)) {
          operator_delete(*(Half **)(pHVar49 + -8),*(long *)pHVar49 + 1);
        }
        pHVar49 = pHVar49 + -0x10;
        lVar44 = lVar44 + 0x20;
      } while (lVar44 != 0);
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                (&local_c8);
      local_4a8 = (undefined1  [8])&aStack_498;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"R","");
      plStack_488 = &lStack_478;
      std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_488,"G","");
      plStack_468 = plVar43;
      std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_468,"B","");
      requestedChannels_00.n = 3;
      requestedChannels_00.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8;
      GetChannelDesc((ImageChannelDesc *)local_548,(Image *)local_278,requestedChannels_00);
      AVar33.memoryResource = pstd::pmr::new_delete_resource();
      SelectChannels(&__return_storage_ptr__->image,(Image *)local_278,(ImageChannelDesc *)local_548
                     ,AVar33);
      p_Var1 = &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) =
           0;
      (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
           (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
      (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
      (__return_storage_ptr__->metadata).MSE.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).MSE.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
      (__return_storage_ptr__->metadata).colorSpace.optionalValue =
           (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
            )0x0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).colorSpace.set = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl = 0;
      *(undefined8 *)
       &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
        _M_header = 0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x34) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x3c) =
           0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue + 8) = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.set = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) =
           0;
      (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
           (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
      (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
      (__return_storage_ptr__->metadata).MSE.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).MSE.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x38) = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.set = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 4) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0xc) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x14) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x1c) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x24) =
           0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x2c) =
           0;
      (__return_storage_ptr__->metadata).renderTimeSeconds.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      (__return_storage_ptr__->metadata).renderTimeSeconds.set = false;
      *(undefined3 *)&(__return_storage_ptr__->metadata).renderTimeSeconds.field_0x5 = 0;
      *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 8) =
           0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x10) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x18) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x20) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x28) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x30) = 0;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = &p_Var1->_M_header;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = &p_Var1->_M_header;
      (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
      _M_node_count = 0;
      InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)local_548);
      lVar44 = -0x60;
      do {
        if (plVar43 != (long *)plVar43[-2]) {
          operator_delete((long *)plVar43[-2],*plVar43 + 1);
        }
        plVar43 = plVar43 + -4;
        lVar44 = lVar44 + 0x20;
      } while (lVar44 != 0);
LAB_0023f058:
      ~Image((Image *)local_278);
      goto LAB_0023f065;
    default:
      ErrorExit<std::__cxx11::string_const&,int&>
                ("%s: %d channel image unsupported.",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0,
                 (int *)&local_5a8);
    }
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector(this_00);
LAB_0023f065:
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)local_3a8)
    ;
    return __return_storage_ptr__;
  }
  pfVar35 = stbi_loadf(*(char **)local_5b0,(int *)local_588,(int *)&local_5a8,&local_590.x,0);
  if (pfVar35 == (float *)0x0) {
    local_278 = (undefined1  [8])stbi_failure_reason();
    ErrorExit<std::__cxx11::string_const&,char_const*>
              ("%s: %s",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_5b0,(char **)local_278);
  }
  local_278 = (undefined1  [8])alloc.memoryResource;
  pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>::vector<float*>
            ((vector<float,pstd::pmr::polymorphic_allocator<float>> *)local_3a8,pfVar35,
             pfVar35 + (long)local_590.x *
                       (long)(int)local_5a8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start *
                       (long)(int)local_588._0_4_,(polymorphic_allocator<float> *)local_278);
  stbi_image_free(pfVar35);
  auVar54 = _auStack_270;
  uVar12 = aaStack_398[0]._8_8_;
  switch(local_590.x) {
  case 1:
    aaStack_398[0]._8_8_ = 0;
    aStack_498._M_allocated_capacity._0_2_ = 0x59;
    VStack_4a0.x = 1.4013e-45;
    VStack_4a0.y = 0.0;
    resolution.super_Tuple2<pbrt::Point2,_int>.y =
         (int)local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    resolution.super_Tuple2<pbrt::Point2,_int>.x = local_588._0_4_;
    local_278 = (undefined1  [8])local_3a8._0_8_;
    auStack_268._8_8_ = uVar12;
    _auStack_270 = stack0xfffffffffffffc60;
    register0x00001200 = ZEXT816(0) << 0x20;
    channels_01.n = 1;
    channels_01.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8
    ;
    local_4a8 = (undefined1  [8])&aStack_498;
    Image(&__return_storage_ptr__->image,
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_278,resolution,
          channels_01);
    p_Var1 = &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) = 0;
    (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
         (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
    (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
    (__return_storage_ptr__->metadata).MSE.optionalValue =
         (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    (__return_storage_ptr__->metadata).MSE.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
    (__return_storage_ptr__->metadata).colorSpace.optionalValue =
         (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
          )0x0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).colorSpace.set = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header
         = 0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x34) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x3c) = 0
    ;
    *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue + 8) = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.set = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) = 0;
    (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
         (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
    (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
    (__return_storage_ptr__->metadata).MSE.optionalValue =
         (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    (__return_storage_ptr__->metadata).MSE.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x38)
         = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.set = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 4) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0xc) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x14) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x1c) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x24) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x2c) = 0
    ;
    (__return_storage_ptr__->metadata).renderTimeSeconds.optionalValue =
         (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    (__return_storage_ptr__->metadata).renderTimeSeconds.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).renderTimeSeconds.field_0x5 = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 8) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x10)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x18)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x20)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x28)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x30)
         = 0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = &p_Var1->_M_header;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = &p_Var1->_M_header;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = 0;
    if (local_4a8 != (undefined1  [8])&aStack_498) {
      operator_delete((void *)local_4a8,aStack_498._M_allocated_capacity + 1);
    }
    pvVar46 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_278;
    break;
  case 2:
    local_4a8 = (undefined1  [8])&aStack_498;
    plVar43 = &lStack_478;
    aaStack_398[0]._8_8_ = 0;
    aStack_498._M_allocated_capacity._0_2_ = 0x59;
    VStack_4a0.x = 1.4013e-45;
    VStack_4a0.y = 0.0;
    lStack_478._0_2_ = 0x41;
    sStack_480 = 1;
    resolution_04.super_Tuple2<pbrt::Point2,_int>.y =
         (int)local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    resolution_04.super_Tuple2<pbrt::Point2,_int>.x = local_588._0_4_;
    local_548._0_8_ = local_3a8._0_8_;
    local_548._8_4_ = local_3a8._8_4_;
    local_548._12_4_ = fStack_39c;
    auStack_538 = (undefined1  [8])aaStack_398[0]._0_8_;
    _fStack_530 = uVar12;
    register0x00001200 = ZEXT816(0) << 0x20;
    channels_14.n = 2;
    channels_14.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8
    ;
    plStack_488 = plVar43;
    Image((Image *)local_278,(vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_548,
          resolution_04,channels_14);
    lVar44 = -0x40;
    do {
      if (plVar43 != (long *)plVar43[-2]) {
        operator_delete((long *)plVar43[-2],*plVar43 + 1);
      }
      plVar43 = plVar43 + -4;
      lVar44 = lVar44 + 0x20;
    } while (lVar44 != 0);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_548);
    aStack_2e8._M_allocated_capacity._0_2_ = 0x59;
    local_2f8.max.x = 1;
    local_2f8.max.y = 0;
    local_2f8.min = (Vec2<int>)&aStack_2e8;
    requestedChannels_01.n = 1;
    requestedChannels_01.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8;
    GetChannelDesc((ImageChannelDesc *)local_4a8,(Image *)local_278,requestedChannels_01);
    AVar33.memoryResource = pstd::pmr::new_delete_resource();
    SelectChannels(&__return_storage_ptr__->image,(Image *)local_278,(ImageChannelDesc *)local_4a8,
                   AVar33);
    p_Var1 = &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) = 0;
    (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
         (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
    (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
    (__return_storage_ptr__->metadata).MSE.optionalValue =
         (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    (__return_storage_ptr__->metadata).MSE.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
    (__return_storage_ptr__->metadata).colorSpace.optionalValue =
         (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
          )0x0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).colorSpace.set = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header
         = 0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x34) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x3c) = 0
    ;
    *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue + 8) = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.set = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) = 0;
    (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
         (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
    (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
    (__return_storage_ptr__->metadata).MSE.optionalValue =
         (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    (__return_storage_ptr__->metadata).MSE.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x38)
         = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.set = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 4) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0xc) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x14) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x1c) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x24) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x2c) = 0
    ;
    (__return_storage_ptr__->metadata).renderTimeSeconds.optionalValue =
         (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    (__return_storage_ptr__->metadata).renderTimeSeconds.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).renderTimeSeconds.field_0x5 = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 8) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x10)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x18)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x20)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x28)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x30)
         = 0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = &p_Var1->_M_header;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = &p_Var1->_M_header;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = 0;
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)local_4a8);
    if (local_2f8.min != (Vec2<int>)&aStack_2e8) {
      operator_delete((void *)local_2f8.min,aStack_2e8._M_allocated_capacity + 1);
    }
    goto LAB_0023ee35;
  case 3:
    plVar43 = &uStack_228;
    aaStack_398[0]._8_8_ = 0;
    auStack_268._0_2_ = 0x52;
    auStack_270 = (undefined1  [8])0x1;
    auVar15 = _auStack_270;
    _sStack_250 = auVar54._32_32_;
    _auStack_270 = auVar15._0_24_;
    puStack_258 = auStack_270 + 0x28;
    LVar14 = _auStack_270;
    auVar15 = _auStack_270;
    stack0xfffffffffffffdba = auVar54._42_22_;
    _auStack_270 = auVar15._0_40_;
    TStack_248.bits._0_2_ = 0x47;
    sStack_250 = 1;
    _auStack_270 = CONCAT832(sStack_250,LVar14);
    plStack_238 = plVar43;
    uStack_228._0_2_ = 0x42;
    local_230 = 1;
    uStack_22c = 0;
    resolution_02.super_Tuple2<pbrt::Point2,_int>.y =
         (int)local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    resolution_02.super_Tuple2<pbrt::Point2,_int>.x = local_588._0_4_;
    local_4a8 = (undefined1  [8])local_3a8._0_8_;
    VStack_4a0 = stack0xfffffffffffffc60;
    aStack_498._M_allocated_capacity = aaStack_398[0]._M_allocated_capacity;
    aStack_498._8_8_ = uVar12;
    register0x00001200 = ZEXT816(0) << 0x20;
    channels_10.n = 3;
    channels_10.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278
    ;
    local_278 = (undefined1  [8])VVar2;
    Image(&__return_storage_ptr__->image,
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_4a8,resolution_02,
          channels_10);
    lVar44 = -0x60;
    p_Var1 = &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) = 0;
    (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
         (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
    (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
    (__return_storage_ptr__->metadata).MSE.optionalValue =
         (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    (__return_storage_ptr__->metadata).MSE.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
    (__return_storage_ptr__->metadata).colorSpace.optionalValue =
         (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
          )0x0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).colorSpace.set = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header
         = 0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x34) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x3c) = 0
    ;
    *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue + 8) = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.set = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) = 0;
    (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
         (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
    (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
    (__return_storage_ptr__->metadata).MSE.optionalValue =
         (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    (__return_storage_ptr__->metadata).MSE.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x38)
         = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.set = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 4) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0xc) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x14) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x1c) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x24) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x2c) = 0
    ;
    (__return_storage_ptr__->metadata).renderTimeSeconds.optionalValue =
         (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    (__return_storage_ptr__->metadata).renderTimeSeconds.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).renderTimeSeconds.field_0x5 = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 8) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x10)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x18)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x20)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x28)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x30)
         = 0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = &p_Var1->_M_header;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = &p_Var1->_M_header;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = 0;
    do {
      if (plVar43 != (long *)plVar43[-2]) {
        operator_delete((long *)plVar43[-2],*plVar43 + 1);
      }
      plVar43 = plVar43 + -4;
      lVar44 = lVar44 + 0x20;
    } while (lVar44 != 0);
    pvVar46 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_4a8;
    break;
  case 4:
    pHVar49 = &HStack_438;
    aaStack_398[0]._8_8_ = 0;
    aStack_498._M_allocated_capacity._0_2_ = 0x52;
    VStack_4a0 = (V2f)0x1;
    lStack_478._0_2_ = 0x47;
    sStack_480 = 1;
    uStack_458._0_2_ = 0x42;
    uStack_460 = 1;
    uStack_45c = 0;
    HStack_438.h = 0x41;
    uStack_440 = 1;
    uStack_43c = 0;
    resolution_03.super_Tuple2<pbrt::Point2,_int>.y =
         (int)local_5a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    resolution_03.super_Tuple2<pbrt::Point2,_int>.x = local_588._0_4_;
    local_2f8.max.x = local_3a8._8_4_;
    local_2f8.max.y = (int)fStack_39c;
    local_2f8.min.x = local_3a8._0_4_;
    local_2f8.min.y = local_3a8._4_4_;
    aStack_2e8._M_allocated_capacity = aaStack_398[0]._M_allocated_capacity;
    aStack_2e8._8_8_ = uVar12;
    register0x00001200 = ZEXT816(0) << 0x20;
    channels_12.n = 4;
    channels_12.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8
    ;
    local_4a8 = (undefined1  [8])&aStack_498;
    plStack_488 = &lStack_478;
    plStack_468 = &uStack_458;
    uStack_448 = pHVar49;
    Image((Image *)local_278,(vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&local_2f8,
          resolution_03,channels_12);
    lVar44 = -0x80;
    do {
      if (pHVar49 != *(Half **)(pHVar49 + -8)) {
        operator_delete(*(Half **)(pHVar49 + -8),*(long *)pHVar49 + 1);
      }
      pHVar49 = pHVar49 + -0x10;
      lVar44 = lVar44 + 0x20;
    } while (lVar44 != 0);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&local_2f8);
    aStack_498._M_allocated_capacity._0_2_ = 0x52;
    VStack_4a0.x = 1.4013e-45;
    VStack_4a0.y = 0.0;
    lStack_478._0_2_ = 0x47;
    sStack_480 = 1;
    uStack_458._0_2_ = 0x42;
    uStack_460 = 1;
    uStack_45c = 0;
    requestedChannels.n = 3;
    requestedChannels.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8;
    local_4a8 = (undefined1  [8])&aStack_498;
    plStack_488 = &lStack_478;
    plStack_468 = &uStack_458;
    GetChannelDesc((ImageChannelDesc *)local_548,(Image *)local_278,requestedChannels);
    AVar33.memoryResource = pstd::pmr::new_delete_resource();
    SelectChannels(&__return_storage_ptr__->image,(Image *)local_278,(ImageChannelDesc *)local_548,
                   AVar33);
    p_Var1 = &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) = 0;
    (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
         (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
    (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
    (__return_storage_ptr__->metadata).MSE.optionalValue =
         (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    (__return_storage_ptr__->metadata).MSE.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
    (__return_storage_ptr__->metadata).colorSpace.optionalValue =
         (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
          )0x0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).colorSpace.set = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header
         = 0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x34) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x3c) = 0
    ;
    *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).pixelBounds.optionalValue + 8) = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).pixelBounds.set = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).fullResolution.optionalValue + 4) = 0;
    (__return_storage_ptr__->metadata).samplesPerPixel.optionalValue =
         (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
    (__return_storage_ptr__->metadata).samplesPerPixel.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).samplesPerPixel.field_0x5 = 0;
    (__return_storage_ptr__->metadata).MSE.optionalValue =
         (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    (__return_storage_ptr__->metadata).MSE.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).MSE.field_0x5 = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x38)
         = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.set = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 4) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0xc) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x14) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x1c) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x24) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).NDCFromWorld.optionalValue + 0x2c) = 0
    ;
    (__return_storage_ptr__->metadata).renderTimeSeconds.optionalValue =
         (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    (__return_storage_ptr__->metadata).renderTimeSeconds.set = false;
    *(undefined3 *)&(__return_storage_ptr__->metadata).renderTimeSeconds.field_0x5 = 0;
    *(undefined8 *)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 8) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x10)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x18)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x20)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x28)
         = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->metadata).cameraFromWorld.optionalValue + 0x30)
         = 0;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = &p_Var1->_M_header;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = &p_Var1->_M_header;
    (__return_storage_ptr__->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = 0;
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)local_548);
    lVar44 = -0x60;
    plVar43 = &uStack_458;
    do {
      if (plVar43 != (long *)plVar43[-2]) {
        operator_delete((long *)plVar43[-2],*plVar43 + 1);
      }
      plVar43 = plVar43 + -4;
      lVar44 = lVar44 + 0x20;
    } while (lVar44 != 0);
LAB_0023ee35:
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)auStack_200);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&vStack_220);
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
               (auStack_270 + 0x30));
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(auStack_270 + 8));
    goto LAB_0023ee69;
  default:
    ErrorExit<std::__cxx11::string_const&,int&>
              ("%s: %d channel image unsupported.",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0,
               &local_590.x);
  }
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(pvVar46);
LAB_0023ee69:
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_3a8);
  return __return_storage_ptr__;
}

Assistant:

ImageAndMetadata Image::Read(const std::string &name, Allocator alloc,
                             ColorEncodingHandle encoding) {
    if (HasExtension(name, "exr"))
        return ReadEXR(name, alloc);
    else if (HasExtension(name, "png"))
        return ReadPNG(name, alloc, encoding);
    else if (HasExtension(name, "pfm"))
        return ReadPFM(name, alloc);
    else if (HasExtension(name, "hdr"))
        return ReadHDR(name, alloc);
    else {
        int x, y, n;
        unsigned char *data = stbi_load(name.c_str(), &x, &y, &n, 0);
        if (data) {
            pstd::vector<uint8_t> pixels(data, data + x * y * n, alloc);
            stbi_image_free(data);
            switch (n) {
            case 1:
                return ImageAndMetadata{
                    Image(std::move(pixels), {x, y}, {"Y"}, ColorEncodingHandle::sRGB),
                    ImageMetadata()};
            case 2: {
                Image image(std::move(pixels), {x, y}, {"Y", "A"},
                            ColorEncodingHandle::sRGB);
                return ImageAndMetadata{image.SelectChannels(image.GetChannelDesc({"Y"})),
                                        ImageMetadata()};
            }
            case 3:
                return ImageAndMetadata{Image(std::move(pixels), {x, y}, {"R", "G", "B"},
                                              ColorEncodingHandle::sRGB),
                                        ImageMetadata()};
            case 4: {
                Image image(std::move(pixels), {x, y}, {"R", "G", "B", "A"},
                            ColorEncodingHandle::sRGB);
                return ImageAndMetadata{
                    image.SelectChannels(image.GetChannelDesc({"R", "G", "B"})),
                    ImageMetadata()};
            }
            default:
                ErrorExit("%s: %d channel image unsupported.", name, n);
            }
        } else
            ErrorExit("%s: no support for reading images with this extension", name);
    }
}